

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_cargo_zero_or_one_without_arg(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  int a;
  char *args [2];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    args[0]._0_4_ = 0x127be1;
    args[0]._4_4_ = 0;
    args[1]._0_4_ = 0x124e63;
    args[1]._4_4_ = 0;
    a = 0;
    iVar1 = cargo_add_option(cargo,0,"--alpha","an option","i?",&a,"5");
    if (iVar1 == 0) {
      iVar1 = cargo_parse(cargo,0,1,2,args);
      if (iVar1 == 0) {
        pcVar2 = (char *)0x0;
        if (a != 5) {
          pcVar2 = "Unexpected value";
        }
      }
      else {
        pcVar2 = "Failed parse";
      }
    }
    else {
      pcVar2 = "Failed to add option";
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_cargo_zero_or_one_without_arg)
{
    char *args[] = { "program", "--alpha" };
    int a = 0;
    ret = cargo_add_option(cargo, 0, "--alpha", "an option", "i?", &a, "5");
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Failed parse");
    cargo_assert(a == 5, "Unexpected value");

    _TEST_CLEANUP();
}